

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

void wasm::
     CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::
     doEndIf(CoalesceLocals *self,Expression **currp)

{
  BasicBlock *__from;
  If *pIVar1;
  reference ppBVar2;
  BasicBlock *last;
  Expression **currp_local;
  CoalesceLocals *self_local;
  
  __from = (self->
           super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
           ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
           super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
           .currBasicBlock;
  startBasicBlock(&(self->
                   super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                   ).
                   super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                   .
                   super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                 );
  link(&(self->
        super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
        ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
        super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
       ,(char *)__from,
       (char *)(self->
               super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
               ).
               super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
               .
               super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
               .currBasicBlock);
  pIVar1 = Expression::cast<wasm::If>(*currp);
  if (pIVar1->ifFalse == (Expression *)0x0) {
    ppBVar2 = std::
              vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
              ::back(&(self->
                      super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                      ).
                      super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                      .
                      super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                      .ifLastBlockStack);
    link(&(self->
          super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
          ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
          super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
         ,(char *)*ppBVar2,
         (char *)(self->
                 super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                 ).
                 super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                 .
                 super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                 .currBasicBlock);
  }
  else {
    ppBVar2 = std::
              vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
              ::back(&(self->
                      super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                      ).
                      super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                      .
                      super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                      .ifLastBlockStack);
    link(&(self->
          super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
          ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
          super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
         ,(char *)*ppBVar2,
         (char *)(self->
                 super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                 ).
                 super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                 .
                 super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                 .currBasicBlock);
    std::
    vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ::pop_back(&(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                ).
                super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                .
                super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                .ifLastBlockStack);
  }
  std::
  vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ::pop_back(&(self->
              super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
              ).
              super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
              .
              super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
              .ifLastBlockStack);
  return;
}

Assistant:

static void doEndIf(SubType* self, Expression** currp) {
    auto* last = self->currBasicBlock;
    self->startBasicBlock();
    // last one is ifFalse's fallthrough if there was one, otherwise it's the
    // ifTrue fallthrough
    self->link(last, self->currBasicBlock);
    if ((*currp)->cast<If>()->ifFalse) {
      // we just linked ifFalse, need to link ifTrue to the end
      self->link(self->ifLastBlockStack.back(), self->currBasicBlock);
      self->ifLastBlockStack.pop_back();
    } else {
      // no ifFalse, so add a fallthrough for if the if is not taken
      self->link(self->ifLastBlockStack.back(), self->currBasicBlock);
    }
    self->ifLastBlockStack.pop_back();
  }